

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

void Ivy_ManCleanupSeq_rec(Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_ObjIsMarkA(pObj);
  if (iVar1 == 0) {
    Ivy_ObjSetMarkA(pObj);
    if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
      pIVar2 = Ivy_ObjFanin0(pObj);
      Ivy_ManCleanupSeq_rec(pIVar2);
    }
    if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
      pIVar2 = Ivy_ObjFanin1(pObj);
      Ivy_ManCleanupSeq_rec(pIVar2);
    }
  }
  return;
}

Assistant:

void Ivy_ManCleanupSeq_rec( Ivy_Obj_t * pObj )
{
    if ( Ivy_ObjIsMarkA(pObj) )
        return;
    Ivy_ObjSetMarkA(pObj);
    if ( pObj->pFanin0 != NULL )
        Ivy_ManCleanupSeq_rec( Ivy_ObjFanin0(pObj) );
    if ( pObj->pFanin1 != NULL )
        Ivy_ManCleanupSeq_rec( Ivy_ObjFanin1(pObj) );
}